

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curve.h
# Opt level: O1

Ref<anurbs::NurbsCurveGeometry<3L>_> __thiscall
anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>::curve_geometry
          (Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  Ref<anurbs::NurbsCurveGeometry<3L>_> RVar2;
  Ref<anurbs::NurbsCurveGeometry<3L>_> RVar3;
  
  (in_RDI->super_EntryBase)._vptr_EntryBase =
       (_func_int **)
       (this->m_curve_geometry).m_entry.
       super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  p_Var1 = (this->m_curve_geometry).m_entry.
           super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (in_RDI->m_key)._M_dataplus._M_p = (pointer)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      RVar2.m_entry.
      super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      RVar2.m_entry.
      super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = in_RDI;
      return (Ref<anurbs::NurbsCurveGeometry<3L>_>)
             RVar2.m_entry.
             super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
      ;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  RVar3.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_RDX._M_pi;
  RVar3.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (Ref<anurbs::NurbsCurveGeometry<3L>_>)
         RVar3.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

TRef curve_geometry() const
    {
        return m_curve_geometry;
    }